

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall cg_box::cg_box(cg_box *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  undefined1 auVar1 [16];
  cg_box *pcVar2;
  cg_box *pcVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  s_i local_68;
  int local_44;
  cg_box *local_40;
  bool *local_38;
  long lVar16;
  
  local_68.s = raw.s;
  local_68.utf8 = raw.utf8;
  local_68._9_7_ = raw._9_7_;
  local_68.i = raw.i;
  iVar9 = 0;
  iVar11 = 0;
  iVar10 = 0;
  local_44 = just;
  local_40 = this;
  local_38 = empty;
  if (raw.i < ((raw.s)->_M_dataplus)._M_p + (raw.s)->_M_string_length) {
    iVar10 = 0;
    iVar11 = 0;
    iVar9 = 0;
    do {
      iVar4 = s_i::get(&local_68);
      iVar5 = iVar9;
      if (iVar9 < iVar10) {
        iVar5 = iVar10;
      }
      iVar9 = iVar9 + 1;
      if (iVar4 == sep) {
        iVar9 = 0;
        iVar10 = iVar5;
      }
      iVar11 = iVar11 + (uint)(iVar4 == sep);
    } while (local_68.i < ((local_68.s)->_M_dataplus)._M_p + (local_68.s)->_M_string_length);
  }
  pcVar2 = local_40;
  iVar5 = iVar9;
  if (iVar9 < iVar10) {
    iVar5 = iVar10;
  }
  bVar13 = iVar9 != 0;
  if (!bVar13) {
    iVar5 = iVar10;
  }
  *local_38 = iVar5 < 1;
  if (iVar5 < 1) {
    fill = -0x80000000;
  }
  iVar10 = 1;
  if (1 < iVar5) {
    iVar10 = iVar5;
  }
  iVar9 = iVar11 + (uint)bVar13 + (uint)(iVar11 + (uint)bVar13 == 0);
  local_40->w = iVar10;
  local_40->h = iVar9;
  uVar12 = iVar9 * iVar10;
  piVar6 = (int *)operator_new__((ulong)uVar12 * 4);
  pcVar3 = local_40;
  iVar10 = local_44;
  pcVar2->data = piVar6;
  auVar1 = _DAT_0010e830;
  if (0 < (int)uVar12) {
    lVar16 = (ulong)uVar12 - 1;
    auVar14._8_4_ = (int)lVar16;
    auVar14._0_8_ = lVar16;
    auVar14._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar8 = 0;
    auVar14 = auVar14 ^ _DAT_0010e830;
    auVar15 = _DAT_0010e810;
    auVar17 = _DAT_0010e820;
    do {
      auVar18 = auVar17 ^ auVar1;
      iVar9 = auVar14._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar9 && auVar14._0_4_ < auVar18._0_4_ || iVar9 < auVar18._4_4_)
                & 1)) {
        piVar6[uVar8] = fill;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        piVar6[uVar8 + 1] = fill;
      }
      auVar18 = auVar15 ^ auVar1;
      iVar11 = auVar18._4_4_;
      if (iVar11 <= iVar9 && (iVar11 != iVar9 || auVar18._0_4_ <= auVar14._0_4_)) {
        piVar6[uVar8 + 2] = fill;
        piVar6[uVar8 + 3] = fill;
      }
      uVar8 = uVar8 + 4;
      lVar16 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar16 + 4;
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar16 + 4;
    } while ((uVar12 + 3 & 0xfffffffc) != uVar8);
  }
  local_68.s = raw.s;
  local_68.utf8 = raw.utf8;
  local_68._9_7_ = raw._9_7_;
  local_68.i = raw.i;
  if (raw.i < ((raw.s)->_M_dataplus)._M_p + (raw.s)->_M_string_length) {
    uVar12 = 0;
    iVar9 = 0;
    do {
      iVar11 = s_i::get(&local_68);
      if (iVar11 == sep) {
        iVar9 = iVar9 + 1;
        uVar12 = 0;
      }
      else {
        iVar5 = pcVar3->w;
        uVar7 = ~uVar12 + iVar5;
        if (iVar10 != 1) {
          uVar7 = uVar12;
        }
        pcVar3->data[(int)(uVar7 + iVar5 * iVar9)] = iVar11;
        uVar12 = uVar12 + 1;
      }
    } while (local_68.i < ((local_68.s)->_M_dataplus)._M_p + (local_68.s)->_M_string_length);
  }
  return;
}

Assistant:

cg_box(s_i raw, int sep, int just, int fill, bool &empty) {
        int maxrow = 0, nrows = 0, rlen = 0;
        for (s_i x = raw; !x.atEnd(); ) {
            if (x.get() == sep) {
                maxrow = max(maxrow, rlen);
                rlen = 0;
                nrows++;
            } else {
                rlen++;
            }
        }
        if (rlen) {
            maxrow = max(maxrow, rlen);
            nrows++;
        }
        empty = maxrow < 1;
        if (empty) fill = OUT_CHAR;
        w = max(1, maxrow);
        h = max(1, nrows);
        data = new int[w*h];
        for (int i = 0; i < w*h; i++) data[i] = fill;

        int row = 0, col = 0;
        for (s_i x = raw; !x.atEnd();) {
            int c = x.get();
            if (c == sep) {
                col = 0;
                row++;
            } else {
                data[w*row + (just == 1 ? w - 1 - col : col)] = c;
                col++;
            }
        }
    }